

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O1

void ImPlot::PlotStemsEx<ImPlot::GetterXsYs<int>,ImPlot::GetterXsYRef<int>>
               (char *label_id,GetterXsYs<int> *get_mark,GetterXsYRef<int> *get_base)

{
  double dVar1;
  TransformerLogLog transformer;
  int iVar2;
  int iVar3;
  ImPlotPlot *pIVar4;
  ImPlotContext *pIVar5;
  bool bVar6;
  ImU32 col;
  long lVar7;
  long lVar8;
  int iVar9;
  int *piVar10;
  int *piVar11;
  int iVar12;
  float fVar13;
  float fVar14;
  double dVar15;
  float fVar16;
  ImPlotPoint local_98;
  ImU32 local_88;
  ImU32 local_84;
  ImDrawList *local_80;
  long local_78;
  uint local_70;
  uint local_6c;
  ulong local_68;
  ulong local_60;
  int *local_58;
  int *local_50;
  int *local_48;
  int *local_40;
  ImPlotContext *local_38;
  
  bVar6 = BeginItem(label_id,0);
  if (bVar6) {
    if ((GImPlot->FitThisFrame == true) && (0 < get_base->Count)) {
      iVar9 = 0;
      do {
        iVar12 = get_mark->Count;
        lVar7 = (long)(((get_mark->Offset + iVar9) % iVar12 + iVar12) % iVar12) *
                (long)get_mark->Stride;
        local_98.x = (double)*(int *)((long)get_mark->Xs + lVar7);
        local_98.y = (double)*(int *)((long)get_mark->Ys + lVar7);
        FitPoint(&local_98);
        iVar12 = get_base->Count;
        local_98.x = (double)*(int *)((long)get_base->Xs +
                                     (long)(((get_base->Offset + iVar9) % iVar12 + iVar12) % iVar12)
                                     * (long)get_base->Stride);
        local_98.y = get_base->YRef;
        FitPoint(&local_98);
        iVar9 = iVar9 + 1;
      } while (iVar9 < get_base->Count);
    }
    pIVar5 = GImPlot;
    local_80 = GetPlotDrawList();
    if ((pIVar5->NextItemData).RenderLine == true) {
      col = ImGui::GetColorU32((pIVar5->NextItemData).Colors);
      iVar9 = GImPlot->CurrentPlot->CurrentYAxis;
      switch(GImPlot->Scales[iVar9]) {
      case 0:
        local_98.x = (double)CONCAT44(local_98.x._4_4_,iVar9);
        RenderLineSegments<ImPlot::GetterXsYs<int>,ImPlot::GetterXsYRef<int>,ImPlot::TransformerLinLin>
                  (get_mark,get_base,(TransformerLinLin *)&local_98,local_80,
                   (pIVar5->NextItemData).LineWeight,col);
        break;
      case 1:
        local_98.x = (double)CONCAT44(local_98.x._4_4_,iVar9);
        RenderLineSegments<ImPlot::GetterXsYs<int>,ImPlot::GetterXsYRef<int>,ImPlot::TransformerLogLin>
                  (get_mark,get_base,(TransformerLogLin *)&local_98,local_80,
                   (pIVar5->NextItemData).LineWeight,col);
        break;
      case 2:
        local_98.x = (double)CONCAT44(local_98.x._4_4_,iVar9);
        RenderLineSegments<ImPlot::GetterXsYs<int>,ImPlot::GetterXsYRef<int>,ImPlot::TransformerLinLog>
                  (get_mark,get_base,(TransformerLinLog *)&local_98,local_80,
                   (pIVar5->NextItemData).LineWeight,col);
        break;
      case 3:
        local_98.x = (double)CONCAT44(local_98.x._4_4_,iVar9);
        RenderLineSegments<ImPlot::GetterXsYs<int>,ImPlot::GetterXsYRef<int>,ImPlot::TransformerLogLog>
                  (get_mark,get_base,(TransformerLogLog *)&local_98,local_80,
                   (pIVar5->NextItemData).LineWeight,col);
      }
    }
    iVar9 = (pIVar5->NextItemData).Marker;
    iVar12 = 0;
    if (iVar9 != -1) {
      iVar12 = iVar9;
    }
    local_84 = ImGui::GetColorU32((pIVar5->NextItemData).Colors + 2);
    local_88 = ImGui::GetColorU32((pIVar5->NextItemData).Colors + 3);
    transformer.YAxis = GImPlot->CurrentPlot->CurrentYAxis;
    lVar7 = (long)transformer.YAxis;
    local_38 = GImPlot;
    local_78 = lVar7;
    switch(GImPlot->Scales[lVar7]) {
    case 0:
      iVar9 = get_mark->Count;
      if (0 < iVar9) {
        piVar10 = get_mark->Xs;
        piVar11 = get_mark->Ys;
        iVar3 = get_mark->Offset;
        local_48 = (int *)CONCAT44(local_48._4_4_,(pIVar5->NextItemData).MarkerSize);
        local_50 = (int *)CONCAT44(local_50._4_4_,(pIVar5->NextItemData).MarkerWeight);
        iVar2 = get_mark->Stride;
        local_60 = (ulong)iVar12;
        iVar12 = 0;
        bVar6 = (pIVar5->NextItemData).RenderMarkerLine;
        local_68 = CONCAT44(local_68._4_4_,(uint)(pIVar5->NextItemData).RenderMarkerFill);
        local_58 = piVar11;
        local_40 = piVar10;
        do {
          lVar8 = (long)(((iVar3 + iVar12) % iVar9 + iVar9) % iVar9) * (long)iVar2;
          fVar13 = (float)(((double)*(int *)((long)piVar10 + lVar8) -
                           (GImPlot->CurrentPlot->XAxis).Range.Min) * GImPlot->Mx +
                          (double)GImPlot->PixelRange[lVar7].Min.x);
          fVar14 = (float)(((double)*(int *)((long)piVar11 + lVar8) -
                           GImPlot->CurrentPlot->YAxis[lVar7].Range.Min) * GImPlot->My[local_78] +
                          (double)GImPlot->PixelRange[lVar7].Min.y);
          local_98.x = (double)CONCAT44(fVar14,fVar13);
          pIVar4 = local_38->CurrentPlot;
          if ((((pIVar4->PlotRect).Min.x <= fVar13) && ((pIVar4->PlotRect).Min.y <= fVar14)) &&
             ((fVar13 < (pIVar4->PlotRect).Max.x && (fVar14 < (pIVar4->PlotRect).Max.y)))) {
            (**(code **)(RenderMarkers<ImPlot::TransformerLinLin,ImPlot::GetterXsYs<int>>(ImPlot::GetterXsYs<int>,ImPlot::TransformerLinLin,ImDrawList&,int,float,bool,unsigned_int,float,bool,unsigned_int)
                         ::marker_table + local_60 * 8))
                      ((ulong)local_48 & 0xffffffff,(ulong)local_50 & 0xffffffff,local_80,&local_98,
                       bVar6,local_84,local_68 & 0xffffffff,local_88);
            piVar10 = local_40;
            piVar11 = local_58;
          }
          iVar12 = iVar12 + 1;
        } while (iVar9 != iVar12);
      }
      break;
    case 1:
      iVar9 = get_mark->Count;
      if (0 < iVar9) {
        local_48 = get_mark->Xs;
        local_50 = get_mark->Ys;
        local_58 = (int *)(ulong)(uint)get_mark->Offset;
        local_60 = CONCAT44(local_60._4_4_,(pIVar5->NextItemData).MarkerSize);
        fVar13 = (pIVar5->NextItemData).MarkerWeight;
        iVar3 = get_mark->Stride;
        local_68 = (ulong)iVar12;
        iVar12 = 0;
        local_6c = (uint)(pIVar5->NextItemData).RenderMarkerLine;
        local_70 = (uint)(pIVar5->NextItemData).RenderMarkerFill;
        do {
          pIVar5 = GImPlot;
          lVar8 = (long)((((int)local_58 + iVar12) % iVar9 + iVar9) % iVar9) * (long)iVar3;
          local_40 = (int *)(double)*(int *)((long)local_50 + lVar8);
          dVar15 = log10((double)*(int *)((long)local_48 + lVar8) /
                         (GImPlot->CurrentPlot->XAxis).Range.Min);
          pIVar4 = pIVar5->CurrentPlot;
          dVar1 = (pIVar4->XAxis).Range.Min;
          fVar14 = (float)((((double)(float)(dVar15 / pIVar5->LogDenX) *
                             ((pIVar4->XAxis).Range.Max - dVar1) + dVar1) - dVar1) * pIVar5->Mx +
                          (double)pIVar5->PixelRange[lVar7].Min.x);
          fVar16 = (float)(((double)local_40 - pIVar4->YAxis[lVar7].Range.Min) *
                           pIVar5->My[local_78] + (double)pIVar5->PixelRange[lVar7].Min.y);
          local_98.x = (double)CONCAT44(fVar16,fVar14);
          pIVar4 = local_38->CurrentPlot;
          if ((((pIVar4->PlotRect).Min.x <= fVar14) && ((pIVar4->PlotRect).Min.y <= fVar16)) &&
             ((fVar14 < (pIVar4->PlotRect).Max.x && (fVar16 < (pIVar4->PlotRect).Max.y)))) {
            (**(code **)(RenderMarkers<ImPlot::TransformerLogLin,ImPlot::GetterXsYs<int>>(ImPlot::GetterXsYs<int>,ImPlot::TransformerLogLin,ImDrawList&,int,float,bool,unsigned_int,float,bool,unsigned_int)
                         ::marker_table + local_68 * 8))
                      (local_60 & 0xffffffff,fVar13,local_80,&local_98,local_6c,local_84,local_70,
                       local_88);
          }
          iVar12 = iVar12 + 1;
        } while (iVar9 != iVar12);
      }
      break;
    case 2:
      iVar9 = get_mark->Count;
      if (0 < iVar9) {
        local_48 = get_mark->Xs;
        local_50 = get_mark->Ys;
        local_58 = (int *)(ulong)(uint)get_mark->Offset;
        local_60 = CONCAT44(local_60._4_4_,(pIVar5->NextItemData).MarkerSize);
        fVar13 = (pIVar5->NextItemData).MarkerWeight;
        iVar3 = get_mark->Stride;
        local_68 = (ulong)iVar12;
        iVar12 = 0;
        local_6c = (uint)(pIVar5->NextItemData).RenderMarkerLine;
        local_70 = (uint)(pIVar5->NextItemData).RenderMarkerFill;
        do {
          pIVar5 = GImPlot;
          lVar8 = (long)((((int)local_58 + iVar12) % iVar9 + iVar9) % iVar9) * (long)iVar3;
          local_40 = (int *)(double)*(int *)((long)local_48 + lVar8);
          dVar15 = log10((double)*(int *)((long)local_50 + lVar8) /
                         GImPlot->CurrentPlot->YAxis[lVar7].Range.Min);
          pIVar4 = pIVar5->CurrentPlot;
          dVar1 = pIVar4->YAxis[lVar7].Range.Min;
          fVar16 = (float)(((double)local_40 - (pIVar4->XAxis).Range.Min) * pIVar5->Mx +
                          (double)pIVar5->PixelRange[lVar7].Min.x);
          fVar14 = (float)((((double)(float)(dVar15 / pIVar5->LogDenY[local_78]) *
                             (pIVar4->YAxis[lVar7].Range.Max - dVar1) + dVar1) - dVar1) *
                           pIVar5->My[local_78] + (double)pIVar5->PixelRange[lVar7].Min.y);
          local_98.x = (double)CONCAT44(fVar14,fVar16);
          pIVar4 = local_38->CurrentPlot;
          if (((((pIVar4->PlotRect).Min.x <= fVar16) && ((pIVar4->PlotRect).Min.y <= fVar14)) &&
              (fVar16 < (pIVar4->PlotRect).Max.x)) && (fVar14 < (pIVar4->PlotRect).Max.y)) {
            (**(code **)(RenderMarkers<ImPlot::TransformerLinLog,ImPlot::GetterXsYs<int>>(ImPlot::GetterXsYs<int>,ImPlot::TransformerLinLog,ImDrawList&,int,float,bool,unsigned_int,float,bool,unsigned_int)
                         ::marker_table + local_68 * 8))
                      (local_60 & 0xffffffff,fVar13,local_80,&local_98,local_6c,local_84,local_70,
                       local_88);
          }
          iVar12 = iVar12 + 1;
        } while (iVar9 != iVar12);
      }
      break;
    case 3:
      RenderMarkers<ImPlot::TransformerLogLog,ImPlot::GetterXsYs<int>>
                (*get_mark,transformer,local_80,iVar12,(pIVar5->NextItemData).MarkerSize,
                 (pIVar5->NextItemData).RenderMarkerLine,local_84,
                 (pIVar5->NextItemData).MarkerWeight,(pIVar5->NextItemData).RenderMarkerFill,
                 local_88);
    }
    pIVar5 = GImPlot;
    PopPlotClipRect();
    ImPlotNextItemData::Reset(&pIVar5->NextItemData);
    pIVar5->PreviousItem = pIVar5->CurrentItem;
    pIVar5->CurrentItem = (ImPlotItem *)0x0;
  }
  return;
}

Assistant:

inline void PlotStemsEx(const char* label_id, const GetterM& get_mark, const GetterB& get_base) {
    if (BeginItem(label_id, ImPlotCol_Line)) {
        if (FitThisFrame()) {
            for (int i = 0; i < get_base.Count; ++i) {
                FitPoint(get_mark(i));
                FitPoint(get_base(i));
            }
        }
        const ImPlotNextItemData& s = GetItemData();
        ImDrawList& DrawList = *GetPlotDrawList();
        // render stems
        if (s.RenderLine) {
            const ImU32 col_line = ImGui::GetColorU32(s.Colors[ImPlotCol_Line]);
            switch (GetCurrentScale()) {
                case ImPlotScale_LinLin: RenderLineSegments(get_mark, get_base, TransformerLinLin(), DrawList, s.LineWeight, col_line); break;
                case ImPlotScale_LogLin: RenderLineSegments(get_mark, get_base, TransformerLogLin(), DrawList, s.LineWeight, col_line); break;
                case ImPlotScale_LinLog: RenderLineSegments(get_mark, get_base, TransformerLinLog(), DrawList, s.LineWeight, col_line); break;
                case ImPlotScale_LogLog: RenderLineSegments(get_mark, get_base, TransformerLogLog(), DrawList, s.LineWeight, col_line); break;
            }
        }
        // render markers
        ImPlotMarker marker = s.Marker == ImPlotMarker_None ? ImPlotMarker_Circle : s.Marker;
        if (marker != ImPlotMarker_None) {
            const ImU32 col_line = ImGui::GetColorU32(s.Colors[ImPlotCol_MarkerOutline]);
            const ImU32 col_fill = ImGui::GetColorU32(s.Colors[ImPlotCol_MarkerFill]);
            switch (GetCurrentScale()) {
                case ImPlotScale_LinLin: RenderMarkers(get_mark, TransformerLinLin(), DrawList, marker, s.MarkerSize, s.RenderMarkerLine, col_line, s.MarkerWeight, s.RenderMarkerFill, col_fill); break;
                case ImPlotScale_LogLin: RenderMarkers(get_mark, TransformerLogLin(), DrawList, marker, s.MarkerSize, s.RenderMarkerLine, col_line, s.MarkerWeight, s.RenderMarkerFill, col_fill); break;
                case ImPlotScale_LinLog: RenderMarkers(get_mark, TransformerLinLog(), DrawList, marker, s.MarkerSize, s.RenderMarkerLine, col_line, s.MarkerWeight, s.RenderMarkerFill, col_fill); break;
                case ImPlotScale_LogLog: RenderMarkers(get_mark, TransformerLogLog(), DrawList, marker, s.MarkerSize, s.RenderMarkerLine, col_line, s.MarkerWeight, s.RenderMarkerFill, col_fill); break;
            }
        }
        EndItem();
    }
}